

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O2

void __thiscall SHOPManagement::Person::changePhoneNumber(Person *this)

{
  ostream *poVar1;
  string new_value;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  string local_30 [32];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"Phone Number(");
  std::__cxx11::string::string(local_30,(string *)&this->m_phone_number);
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,"): ");
  std::__cxx11::string::~string(local_30);
  std::istream::ignore();
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_50);
  if (local_48 != 0) {
    std::__cxx11::string::_M_assign((string *)&this->m_phone_number);
    std::__cxx11::string::assign(Helper::m_message_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Person::changePhoneNumber()
    {
        std::string new_value;
        std::cout << "Phone Number(" << this->getPhoneNumber() << "): ";
        std::cin.ignore();
        std::getline(std::cin, new_value);

        if (!new_value.empty())
        {
            this->setPhoneNumber(new_value);
            Helper::m_message = "Phone number has been changed successfully.";
        }
    }